

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_utxoutil.cpp
# Opt level: O1

void __thiscall UtxoUtil_ConvertToUtxo_Test::TestBody(UtxoUtil_ConvertToUtxo_Test *this)

{
  undefined8 lhs;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  Utxo utxo;
  UtxoData dest;
  UtxoData utxo1;
  AssertHelper local_b50 [2];
  undefined1 local_b40 [16];
  undefined1 local_b30 [32];
  AssertHelper local_b10;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b08 [2];
  AssertHelper local_af8 [3];
  internal local_ae0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ad8;
  Utxo local_ad0;
  Txid local_9f8 [2];
  uint local_9b0 [298];
  UtxoData local_508 [40];
  Txid local_4e0;
  uint local_4c0 [136];
  undefined4 local_2a0;
  
  cfd::UtxoData::UtxoData(local_508);
  local_ad0.block_height = (uint64_t)(local_ad0.block_hash + 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,"9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a"
             ,"");
  cfd::core::Txid::Txid(local_9f8,(string *)&local_ad0);
  cfd::core::Txid::operator=(&local_4e0,local_9f8);
  local_9f8[0]._vptr_Txid = (_func_int **)&PTR__Txid_002e1e60;
  if (local_9f8[0].data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_9f8[0].data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((uint8_t *)local_ad0.block_height != local_ad0.block_hash + 8) {
    operator_delete((void *)local_ad0.block_height);
  }
  local_4c0[0] = 1;
  local_2a0 = 4;
  memset(&local_ad0,0,0xd8);
  cfd::UtxoData::UtxoData((UtxoData *)local_9f8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::UtxoUtil::ConvertToUtxo(local_508,&local_ad0,(UtxoData *)local_9f8);
    }
  }
  else {
    testing::Message::Message((Message *)local_b30);
    testing::internal::AssertHelper::AssertHelper
              (local_b50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_utxoutil.cpp"
               ,0x37,
               "Expected: (UtxoUtil::ConvertToUtxo(utxo1, &utxo, &dest)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(local_b50,(Message *)local_b30);
    testing::internal::AssertHelper::~AssertHelper(local_b50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b30._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b30._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b30._0_8_ + 8))();
      }
      local_b30._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  cfd::core::Txid::GetData();
  cfd::core::ByteData::GetBytes();
  auVar4[0] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_b30._0_8_ ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[0]);
  auVar4[1] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b30._0_8_ + 1) ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[1]);
  auVar4[2] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b30._0_8_ + 2) ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[2]);
  auVar4[3] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b30._0_8_ + 3) ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[3]);
  auVar4[4] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b30._0_8_ + 4) ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[4]);
  auVar4[5] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b30._0_8_ + 5) ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[5]);
  auVar4[6] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b30._0_8_ + 6) ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[6]);
  auVar4[7] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b30._0_8_ + 7) ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[7]);
  auVar4[8] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b30._0_8_ + 8) ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[8]);
  auVar4[9] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b30._0_8_ + 9) ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[9]);
  auVar4[10] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_b30._0_8_ + 10) ==
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                local_ad0.txid[10]);
  auVar4[0xb] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b30._0_8_ + 0xb) ==
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 local_ad0.txid[0xb]);
  auVar4[0xc] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b30._0_8_ + 0xc) ==
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 local_ad0.txid[0xc]);
  auVar4[0xd] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b30._0_8_ + 0xd) ==
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 local_ad0.txid[0xd]);
  auVar4[0xe] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b30._0_8_ + 0xe) ==
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 local_ad0.txid[0xe]);
  auVar4[0xf] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b30._0_8_ + 0xf) ==
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 local_ad0.txid[0xf]);
  auVar3[0] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b30._0_8_ + 0x10) ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[0x10]);
  auVar3[1] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b30._0_8_ + 0x11) ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[0x11]);
  auVar3[2] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b30._0_8_ + 0x12) ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[0x12]);
  auVar3[3] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b30._0_8_ + 0x13) ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[0x13]);
  auVar3[4] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b30._0_8_ + 0x14) ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[0x14]);
  auVar3[5] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b30._0_8_ + 0x15) ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[0x15]);
  auVar3[6] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b30._0_8_ + 0x16) ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[0x16]);
  auVar3[7] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b30._0_8_ + 0x17) ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[0x17]);
  auVar3[8] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b30._0_8_ + 0x18) ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[0x18]);
  auVar3[9] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b30._0_8_ + 0x19) ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
               local_ad0.txid[0x19]);
  auVar3[10] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_b30._0_8_ + 0x1a) ==
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                local_ad0.txid[0x1a]);
  auVar3[0xb] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b30._0_8_ + 0x1b) ==
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 local_ad0.txid[0x1b]);
  auVar3[0xc] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b30._0_8_ + 0x1c) ==
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 local_ad0.txid[0x1c]);
  auVar3[0xd] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b30._0_8_ + 0x1d) ==
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 local_ad0.txid[0x1d]);
  auVar3[0xe] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b30._0_8_ + 0x1e) ==
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 local_ad0.txid[0x1e]);
  auVar3[0xf] = -(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b30._0_8_ + 0x1f) ==
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 local_ad0.txid[0x1f]);
  auVar3 = auVar3 & auVar4;
  local_b10.data_._0_1_ =
       (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) == 0xffff;
  local_b08[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b30._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_b30._0_8_);
  }
  if (local_b50[0].data_ != (AssertHelperData *)0x0) {
    operator_delete(local_b50[0].data_);
  }
  if ((internal)local_b10.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_b50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b30,(internal *)&local_b10,
               (AssertionResult *)
               "(memcmp(utxo.txid, utxo1.txid.GetData().GetBytes().data(), sizeof(utxo.txid)) == 0)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_af8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_utxoutil.cpp"
               ,0x38,(char *)local_b30._0_8_);
    testing::internal::AssertHelper::operator=(local_af8,(Message *)local_b50);
    testing::internal::AssertHelper::~AssertHelper(local_af8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b30._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_b30 + 0x10)) {
      operator_delete((void *)local_b30._0_8_);
    }
    if (local_b50[0].data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_b50[0].data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_b50[0].data_ + 8))();
      }
      local_b50[0].data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_b08,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_b30,"utxo.vout","utxo1.vout",&local_ad0.vout,local_4c0);
  if (local_b30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b50);
    if ((pointer)local_b30._8_8_ == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_b30._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_utxoutil.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b10,(Message *)local_b50);
    testing::internal::AssertHelper::~AssertHelper(&local_b10);
    if (local_b50[0].data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_b50[0].data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_b50[0].data_ + 8))();
      }
      local_b50[0].data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_b30 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Txid::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  lhs = local_b30._0_8_;
  cfd::core::Txid::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_ae0,"dest.txid.GetData().GetHex().c_str()",
             "utxo1.txid.GetData().GetHex().c_str()",(char *)lhs,(char *)local_b50[0].data_);
  if (local_b50[0].data_ != (AssertHelperData *)local_b40) {
    operator_delete(local_b50[0].data_);
  }
  if (local_af8[0].data_ != (AssertHelperData *)0x0) {
    operator_delete(local_af8[0].data_);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b30._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b30 + 0x10))
  {
    operator_delete((void *)local_b30._0_8_);
  }
  if ((void *)CONCAT71(local_b10.data_._1_7_,local_b10.data_._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_b10.data_._1_7_,local_b10.data_._0_1_));
  }
  if (local_ae0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b30);
    if (local_ad8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_ad8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_b50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_utxoutil.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=(local_b50,(Message *)local_b30);
    testing::internal::AssertHelper::~AssertHelper(local_b50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b30._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b30._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b30._0_8_ + 8))();
      }
      local_b30._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_ad8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_b30,"dest.vout","utxo1.vout",local_9b0,local_4c0);
  if (local_b30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b50);
    if ((pointer)local_b30._8_8_ == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_b30._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_utxoutil.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b10,(Message *)local_b50);
    testing::internal::AssertHelper::~AssertHelper(&local_b10);
    if (local_b50[0].data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_b50[0].data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_b50[0].data_ + 8))();
      }
      local_b50[0].data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_b30 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::UtxoData::~UtxoData((UtxoData *)local_9f8);
  cfd::UtxoData::~UtxoData(local_508);
  return;
}

Assistant:

TEST(UtxoUtil, ConvertToUtxo)
{
  UtxoData utxo1;
  utxo1.txid = Txid("9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a");
  utxo1.vout = 1;
  utxo1.address_type = AddressType::kP2wpkhAddress;

  Utxo utxo;
  memset(&utxo, 0, sizeof(utxo));
  UtxoData dest;

  EXPECT_NO_THROW((UtxoUtil::ConvertToUtxo(utxo1, &utxo, &dest)));
  EXPECT_TRUE((memcmp(utxo.txid, utxo1.txid.GetData().GetBytes().data(), sizeof(utxo.txid)) == 0));
  EXPECT_EQ(utxo.vout, utxo1.vout);
  EXPECT_STREQ(dest.txid.GetData().GetHex().c_str(),
               utxo1.txid.GetData().GetHex().c_str());
  EXPECT_EQ(dest.vout, utxo1.vout);
}